

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O1

void __thiscall PolicyPureVector::PolicyPureVector(PolicyPureVector *this,PolicyPureVector *o)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  PolicyDiscretePure::PolicyDiscretePure((PolicyDiscretePure *)this,(PolicyDiscretePure *)o);
  *(undefined ***)this = &PTR__PolicyPureVector_005aecd8;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_domainToActionIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_agentI = o->_m_agentI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_30,&o->_m_domainToActionIndices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_m_domainToActionIndices,&local_30);
  if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

PolicyPureVector::PolicyPureVector(const PolicyPureVector& o) :
    PolicyDiscretePure(o)
{
    if(DEBUG_PPV)    cout << " clone PolicyPureVector ";
    _m_agentI = o._m_agentI;
    _m_domainToActionIndices =vector<Index>(o._m_domainToActionIndices);
}